

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

void HUF_fillDTableX2Level2
               (HUF_DEltX2 *DTable,U32 sizeLog,U32 consumed,U32 *rankValOrigin,int minWeight,
               sortedSymbol_t *sortedSymbols,U32 sortedListSize,U32 nbBitsBaseline,U16 baseSeq)

{
  HUF_DEltX2 *pHVar1;
  U32 UVar2;
  char cVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint local_8c;
  U32 end;
  U32 i_1;
  U32 start;
  U32 length;
  U32 nbBits;
  U32 weight;
  U32 symbol;
  U32 s;
  U32 skipSize;
  U32 i;
  U32 rankVal [13];
  HUF_DEltX2 DElt;
  sortedSymbol_t *sortedSymbols_local;
  int minWeight_local;
  U32 *rankValOrigin_local;
  U32 consumed_local;
  U32 sizeLog_local;
  HUF_DEltX2 *DTable_local;
  
  unique0x100001aa = sortedSymbols;
  memcpy(&skipSize,rankValOrigin,0x34);
  cVar3 = (char)consumed;
  if (1 < minWeight) {
    uVar5 = (&skipSize)[minWeight];
    MEM_writeLE16(rankVal + 0xb,baseSeq);
    rankVal[0xb]._0_3_ = CONCAT12(cVar3,(undefined2)rankVal[0xb]);
    rankVal[0xb] = CONCAT13(1,(undefined3)rankVal[0xb]);
    for (s = 0; s < uVar5; s = s + 1) {
      pHVar1 = DTable + s;
      pHVar1->sequence = (undefined2)rankVal[0xb];
      pHVar1->nbBits = cVar3;
      pHVar1->length = 1;
    }
  }
  for (weight = 0; weight < sortedListSize; weight = weight + 1) {
    uVar5 = (uint)stack0xffffffffffffffd0[weight].weight;
    cVar4 = (char)nbBitsBaseline - stack0xffffffffffffffd0[weight].weight;
    iVar6 = 1 << ((char)sizeLog - cVar4 & 0x1fU);
    UVar2 = (&skipSize)[uVar5];
    MEM_writeLE16(rankVal + 0xb,baseSeq + (ushort)stack0xffffffffffffffd0[weight].symbol * 0x100);
    cVar4 = cVar4 + cVar3;
    rankVal[0xb]._0_3_ = CONCAT12(cVar4,(undefined2)rankVal[0xb]);
    rankVal[0xb] = CONCAT13(2,(undefined3)rankVal[0xb]);
    local_8c = UVar2;
    do {
      uVar7 = local_8c + 1;
      pHVar1 = DTable + local_8c;
      pHVar1->sequence = (undefined2)rankVal[0xb];
      pHVar1->nbBits = cVar4;
      pHVar1->length = 2;
      local_8c = uVar7;
    } while (uVar7 < UVar2 + iVar6);
    (&skipSize)[uVar5] = iVar6 + (&skipSize)[uVar5];
  }
  return;
}

Assistant:

static void HUF_fillDTableX2Level2(HUF_DEltX2* DTable, U32 sizeLog, const U32 consumed,
                           const U32* rankValOrigin, const int minWeight,
                           const sortedSymbol_t* sortedSymbols, const U32 sortedListSize,
                           U32 nbBitsBaseline, U16 baseSeq)
{
    HUF_DEltX2 DElt;
    U32 rankVal[HUF_TABLELOG_MAX + 1];

    /* get pre-calculated rankVal */
    memcpy(rankVal, rankValOrigin, sizeof(rankVal));

    /* fill skipped values */
    if (minWeight>1) {
        U32 i, skipSize = rankVal[minWeight];
        MEM_writeLE16(&(DElt.sequence), baseSeq);
        DElt.nbBits   = (BYTE)(consumed);
        DElt.length   = 1;
        for (i = 0; i < skipSize; i++)
            DTable[i] = DElt;
    }

    /* fill DTable */
    {   U32 s; for (s=0; s<sortedListSize; s++) {   /* note : sortedSymbols already skipped */
            const U32 symbol = sortedSymbols[s].symbol;
            const U32 weight = sortedSymbols[s].weight;
            const U32 nbBits = nbBitsBaseline - weight;
            const U32 length = 1 << (sizeLog-nbBits);
            const U32 start = rankVal[weight];
            U32 i = start;
            const U32 end = start + length;

            MEM_writeLE16(&(DElt.sequence), (U16)(baseSeq + (symbol << 8)));
            DElt.nbBits = (BYTE)(nbBits + consumed);
            DElt.length = 2;
            do { DTable[i++] = DElt; } while (i<end);   /* since length >= 1 */

            rankVal[weight] += length;
    }   }
}